

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O1

int __thiscall
QTlsPrivate::TlsCryptographOpenSSL::init(TlsCryptographOpenSSL *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QSslSocketPrivate *in_RDX;
  
  this->q = (QSslSocket *)ctx;
  this->d = in_RDX;
  QList<QOcspResponse>::clear(&this->ocspResponses);
  iVar1 = QByteArray::clear();
  this->systemOrSslErrorDetected = false;
  this->handshakeInterrupted = false;
  this->fetchAuthorityInformation = false;
  if ((this->caToFetch).super__Optional_base<QSslCertificate,_false,_false>._M_payload.
      super__Optional_payload<QSslCertificate,_true,_false,_false>.
      super__Optional_payload_base<QSslCertificate>._M_engaged == true) {
    (this->caToFetch).super__Optional_base<QSslCertificate,_false,_false>._M_payload.
    super__Optional_payload<QSslCertificate,_true,_false,_false>.
    super__Optional_payload_base<QSslCertificate>._M_engaged = false;
    iVar1 = QSslCertificate::~QSslCertificate((QSslCertificate *)&this->caToFetch);
    return iVar1;
  }
  return iVar1;
}

Assistant:

void TlsCryptographOpenSSL::init(QSslSocket *qObj, QSslSocketPrivate *dObj)
{
    Q_ASSERT(qObj);
    Q_ASSERT(dObj);
    q = qObj;
    d = dObj;

    ocspResponses.clear();
    ocspResponseDer.clear();

    systemOrSslErrorDetected = false;
    handshakeInterrupted = false;

    fetchAuthorityInformation = false;
    caToFetch.reset();
}